

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O1

int use_cream_pie(obj *obj)

{
  int iVar1;
  char cVar2;
  boolean bVar3;
  uint uVar4;
  int extraout_EAX;
  char *pcVar5;
  char *pcVar6;
  char *oldstr;
  bool bVar7;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    if (ublindf == (obj *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = ublindf->oartifact != '\x1d';
    }
  }
  cVar2 = (char)u.ucreamed;
  iVar1 = obj->quan;
  if (1 < iVar1) {
    obj = splitobj(obj,1);
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
    pcVar5 = body_part(2);
    pcVar6 = xname(obj);
    oldstr = the(pcVar6);
    pcVar6 = "one of ";
    if (iVar1 < 2) {
      pcVar6 = "";
    }
    else {
      oldstr = makeplural(oldstr);
    }
    pline("You immerse your %s in %s%s.",pcVar5,pcVar6,oldstr);
  }
  else {
    pline("You give yourself a facial.");
  }
  bVar3 = can_blnd((monst *)0x0,&youmonst,0xfe,obj);
  if (bVar3 != '\0') {
    uVar4 = mt_random();
    u.ucreamed = u.ucreamed + uVar4 % 0x19 + 1;
    make_blinded((ulong)(uVar4 % 0x19) + (ulong)u.uprops[0x1e].intrinsic + 1,'\0');
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
        (((u.uprops[0x1e].intrinsic != 0 ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) && (bVar7)))))))) {
      pcVar6 = "more ";
      if (cVar2 == '\0') {
        pcVar6 = "";
      }
      pcVar5 = body_part(2);
      pline("There\'s %ssticky goop all over your %s.",pcVar6,pcVar5);
    }
    else {
      pcVar6 = body_part(2);
      pline("You can\'t see through all the sticky goop on your %s.",pcVar6);
    }
    if (flags.verbose != '\0') {
      pcVar6 = body_part(2);
      pline("Use the command #wipe to clean your %s.",pcVar6);
    }
  }
  if ((obj->field_0x4a & 4) != 0) {
    verbalize("You used it, you bought it!");
    bill_dummy_object(obj);
  }
  obj_extract_self(obj);
  delobj(obj);
  return extraout_EAX;
}

Assistant:

static int use_cream_pie(struct obj *obj)
{
	boolean wasblind = Blind;
	boolean wascreamed = u.ucreamed;
	boolean several = FALSE;

	if (obj->quan > 1L) {
		several = TRUE;
		obj = splitobj(obj, 1L);
	}
	if (Hallucination)
		pline("You give yourself a facial.");
	else
		pline("You immerse your %s in %s%s.", body_part(FACE),
			several ? "one of " : "",
			several ? makeplural(the(xname(obj))) : the(xname(obj)));
	if (can_blnd(NULL, &youmonst, AT_WEAP, obj)) {
		int blindinc = rnd(25);
		u.ucreamed += blindinc;
		make_blinded(Blinded + (long)blindinc, FALSE);
		if (!Blind || (Blind && wasblind))
			pline("There's %ssticky goop all over your %s.",
				wascreamed ? "more " : "",
				body_part(FACE));
		else /* Blind  && !wasblind */
			pline("You can't see through all the sticky goop on your %s.",
				body_part(FACE));
		if (flags.verbose)
		    pline("Use the command #wipe to clean your %s.", body_part(FACE));
	}
	if (obj->unpaid) {
		verbalize("You used it, you bought it!");
		bill_dummy_object(obj);
	}
	obj_extract_self(obj);
	delobj(obj);
	return 1;
}